

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int deflate(z_streamp strm,int flush)

{
  Bytef BVar1;
  uInt uVar2;
  int iVar3;
  deflate_state *s;
  gz_headerp pgVar4;
  Bytef *pBVar5;
  Bytef *pBVar6;
  Bytef *pBVar7;
  ulg uVar8;
  Posf *__s;
  uint uVar9;
  Bytef BVar10;
  int iVar11;
  uint uVar12;
  block_state bVar13;
  uLong uVar14;
  ulg uVar15;
  ulong uVar16;
  uint uVar17;
  ulong __n;
  ulong __n_00;
  ulong uVar18;
  ulong local_48;
  uint local_3c;
  
  iVar11 = deflateStateCheck(strm);
  if (5 < (uint)flush) {
    return -2;
  }
  if (iVar11 != 0) {
    return -2;
  }
  if (strm->next_out == (Bytef *)0x0) {
LAB_00115c4f:
    strm->msg = "stream error";
    return -2;
  }
  s = strm->state;
  uVar2 = strm->avail_in;
  if (((uVar2 != 0) && (strm->next_in == (Bytef *)0x0)) || ((flush != 4 && (s->status == 0x29a))))
  goto LAB_00115c4f;
  if (strm->avail_out == 0) goto LAB_001160f0;
  iVar11 = s->last_flush;
  s->last_flush = flush;
  if (s->pending == 0) {
    if (uVar2 == 0) {
      if ((flush != 4) &&
         ((int)((uint)(flush < 5) * 9 + flush * 2 + -9) <=
          (int)((uint)(iVar11 < 5) * 9 + iVar11 * 2 + -9))) goto LAB_001160f0;
    }
LAB_00115cac:
    if (s->status == 0x2a) {
      uVar12 = s->w_bits * 0x1000 - 0x7800;
      uVar17 = 0;
      if ((s->strategy < 2) && (iVar11 = s->level, 1 < iVar11)) {
        uVar17 = 0x40;
        if (5 < iVar11) {
          uVar17 = (iVar11 != 6 | 2) << 6;
        }
      }
      uVar9 = uVar17 + 0x20 + uVar12;
      if (s->strstart == 0) {
        uVar9 = uVar17 | uVar12;
      }
      uVar15 = s->pending;
      s->pending = uVar15 + 1;
      s->pending_buf[uVar15] = (Bytef)(uVar9 >> 8);
      uVar15 = s->pending;
      s->pending = uVar15 + 1;
      s->pending_buf[uVar15] = ((char)(uVar9 / 0x1f) * -0x1f + (byte)uVar9 | (byte)uVar9) ^ 0x1f;
      if (s->strstart != 0) {
        BVar10 = *(Bytef *)((long)&strm->adler + 2);
        BVar1 = *(Bytef *)((long)&strm->adler + 3);
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = BVar1;
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = BVar10;
        uVar14 = strm->adler;
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = (Bytef)(uVar14 >> 8);
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = (Bytef)uVar14;
      }
      uVar14 = adler32(0,(Bytef *)0x0,0);
      strm->adler = uVar14;
      s->status = 0x71;
      flush_pending(strm);
      if (s->pending != 0) goto LAB_00115df3;
    }
    else if ((s->status == 0x29a) && (strm->avail_in != 0)) {
LAB_001160f0:
      strm->msg = "buffer error";
      return -5;
    }
    if (s->status == 0x39) {
      uVar14 = crc32(0,(uchar *)0x0,0);
      strm->adler = uVar14;
      uVar15 = s->pending;
      s->pending = uVar15 + 1;
      s->pending_buf[uVar15] = '\x1f';
      uVar15 = s->pending;
      s->pending = uVar15 + 1;
      s->pending_buf[uVar15] = 0x8b;
      uVar15 = s->pending;
      s->pending = uVar15 + 1;
      s->pending_buf[uVar15] = '\b';
      pgVar4 = s->gzhead;
      if (pgVar4 == (gz_headerp)0x0) {
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = '\0';
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = '\0';
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = '\0';
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = '\0';
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = '\0';
        BVar10 = '\x02';
        if (s->level != 9) {
          BVar10 = (s->level < 2 || 1 < s->strategy) << 2;
        }
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = BVar10;
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = '\x03';
        s->status = 0x71;
        flush_pending(strm);
        if (s->pending != 0) goto LAB_00115c97;
      }
      else {
        iVar11 = pgVar4->text;
        iVar3 = pgVar4->hcrc;
        pBVar5 = pgVar4->extra;
        pBVar6 = pgVar4->name;
        pBVar7 = pgVar4->comment;
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] =
             (pBVar7 != (Bytef *)0x0) << 4 |
             (pBVar6 != (Bytef *)0x0) << 3 |
             (pBVar5 != (Bytef *)0x0) << 2 | (iVar3 != 0) * '\x02' | iVar11 != 0;
        uVar14 = s->gzhead->time;
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = (Bytef)uVar14;
        BVar10 = *(Bytef *)((long)&s->gzhead->time + 1);
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = BVar10;
        BVar10 = *(Bytef *)((long)&s->gzhead->time + 2);
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = BVar10;
        BVar10 = *(Bytef *)((long)&s->gzhead->time + 3);
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = BVar10;
        BVar10 = '\x02';
        if (s->level != 9) {
          BVar10 = (s->level < 2 || 1 < s->strategy) << 2;
        }
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = BVar10;
        iVar11 = s->gzhead->os;
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = (Bytef)iVar11;
        if (s->gzhead->extra != (Bytef *)0x0) {
          uVar2 = s->gzhead->extra_len;
          uVar15 = s->pending;
          s->pending = uVar15 + 1;
          s->pending_buf[uVar15] = (Bytef)uVar2;
          BVar10 = *(Bytef *)((long)&s->gzhead->extra_len + 1);
          uVar15 = s->pending;
          s->pending = uVar15 + 1;
          s->pending_buf[uVar15] = BVar10;
        }
        if (s->gzhead->hcrc != 0) {
          uVar14 = crc32(strm->adler,s->pending_buf,(uInt)s->pending);
          strm->adler = uVar14;
        }
        s->gzindex = 0;
        s->status = 0x45;
      }
    }
    if (s->status == 0x45) {
      if (s->gzhead->extra != (Bytef *)0x0) {
        local_48 = s->pending;
        local_3c = (uint)(ushort)s->gzhead->extra_len - (int)s->gzindex;
        while( true ) {
          uVar16 = s->pending_buf_size;
          uVar15 = s->pending;
          __n = (ulong)local_3c;
          if (uVar15 + __n <= uVar16) break;
          __n_00 = uVar16 - uVar15 & 0xffffffff;
          memcpy(s->pending_buf + uVar15,s->gzhead->extra + s->gzindex,__n_00);
          uVar18 = s->pending_buf_size;
          s->pending = uVar18;
          if (local_48 < uVar18 && s->gzhead->hcrc != 0) {
            uVar14 = crc32(strm->adler,s->pending_buf + local_48,(int)uVar18 - (int)local_48);
            strm->adler = uVar14;
          }
          s->gzindex = s->gzindex + __n_00;
          flush_pending(strm);
          if (s->pending != 0) {
            s->last_flush = -1;
            goto LAB_0011622c;
          }
          local_3c = local_3c - (int)(uVar16 - uVar15);
          local_48 = 0;
        }
        memcpy(s->pending_buf + uVar15,s->gzhead->extra + s->gzindex,__n);
        uVar18 = __n + s->pending;
        s->pending = uVar18;
        if ((s->gzhead->hcrc != 0) && (local_48 < uVar18)) {
          uVar14 = crc32(strm->adler,s->pending_buf + local_48,(int)uVar18 - (int)local_48);
          strm->adler = uVar14;
        }
        s->gzindex = 0;
LAB_0011622c:
        if (uVar16 < uVar15 + __n) {
          return 0;
        }
      }
      s->status = 0x49;
    }
    if (s->status == 0x49) {
      if (s->gzhead->name != (Bytef *)0x0) {
        uVar15 = s->pending;
        do {
          uVar16 = s->pending;
          if (uVar16 == s->pending_buf_size) {
            if (uVar15 < uVar16 && s->gzhead->hcrc != 0) {
              uVar14 = crc32(strm->adler,s->pending_buf + uVar15,(int)uVar16 - (int)uVar15);
              strm->adler = uVar14;
            }
            flush_pending(strm);
            if (s->pending != 0) goto LAB_00115c97;
            uVar15 = 0;
          }
          pBVar5 = s->gzhead->name;
          uVar8 = s->gzindex;
          s->gzindex = uVar8 + 1;
          BVar10 = pBVar5[uVar8];
          uVar8 = s->pending;
          s->pending = uVar8 + 1;
          s->pending_buf[uVar8] = BVar10;
        } while (BVar10 != '\0');
        if ((s->gzhead->hcrc != 0) && (uVar15 < s->pending)) {
          uVar14 = crc32(strm->adler,s->pending_buf + uVar15,(int)s->pending - (int)uVar15);
          strm->adler = uVar14;
        }
        s->gzindex = 0;
      }
      s->status = 0x5b;
    }
    if (s->status == 0x5b) {
      if (s->gzhead->comment != (Bytef *)0x0) {
        uVar15 = s->pending;
        do {
          uVar16 = s->pending;
          if (uVar16 == s->pending_buf_size) {
            if (uVar15 < uVar16 && s->gzhead->hcrc != 0) {
              uVar14 = crc32(strm->adler,s->pending_buf + uVar15,(int)uVar16 - (int)uVar15);
              strm->adler = uVar14;
            }
            flush_pending(strm);
            if (s->pending != 0) goto LAB_00115c97;
            uVar15 = 0;
          }
          pBVar5 = s->gzhead->comment;
          uVar8 = s->gzindex;
          s->gzindex = uVar8 + 1;
          BVar10 = pBVar5[uVar8];
          uVar8 = s->pending;
          s->pending = uVar8 + 1;
          s->pending_buf[uVar8] = BVar10;
        } while (BVar10 != '\0');
        if ((s->gzhead->hcrc != 0) && (uVar15 < s->pending)) {
          uVar14 = crc32(strm->adler,s->pending_buf + uVar15,(int)s->pending - (int)uVar15);
          strm->adler = uVar14;
        }
      }
      s->status = 0x67;
    }
    if (s->status == 0x67) {
      if (s->gzhead->hcrc != 0) {
        if ((s->pending_buf_size < s->pending + 2) && (flush_pending(strm), s->pending != 0))
        goto LAB_00115c97;
        uVar14 = strm->adler;
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = (Bytef)uVar14;
        BVar10 = *(Bytef *)((long)&strm->adler + 1);
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = BVar10;
        uVar14 = crc32(0,(uchar *)0x0,0);
        strm->adler = uVar14;
      }
      s->status = 0x71;
      flush_pending(strm);
      if (s->pending != 0) goto LAB_00115c97;
    }
    if (((strm->avail_in != 0) || (s->lookahead != 0)) || ((flush != 0 && (s->status != 0x29a)))) {
      if ((long)s->level == 0) {
        bVar13 = deflate_stored(s,flush);
      }
      else if (s->strategy == 3) {
        bVar13 = deflate_rle(s,flush);
      }
      else if (s->strategy == 2) {
        bVar13 = deflate_huff(s,flush);
      }
      else {
        bVar13 = (*configuration_table[s->level].func)(s,flush);
      }
      if ((bVar13 & ~block_done) == finish_started) {
        s->status = 0x29a;
      }
      if ((bVar13 & ~finish_started) == need_more) {
        if (strm->avail_out != 0) {
          return 0;
        }
LAB_00115df3:
        s->last_flush = -1;
        return 0;
      }
      if (bVar13 == block_done) {
        if (flush != 5) {
          if (flush == 1) {
            _tr_align(s);
          }
          else {
            _tr_stored_block(s,(charf *)0x0,0,0);
            if (flush == 3) {
              __s = s->head;
              uVar16 = (ulong)(s->hash_size - 1);
              __s[uVar16] = 0;
              memset(__s,0,uVar16 * 2);
              if (s->lookahead == 0) {
                s->strstart = 0;
                s->block_start = 0;
                s->insert = 0;
              }
            }
          }
        }
        flush_pending(strm);
        if (strm->avail_out == 0) goto LAB_00115c97;
      }
    }
    if (flush == 4) {
      if (s->wrap < 1) {
        return 1;
      }
      uVar14 = strm->adler;
      if (s->wrap == 2) {
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = (Bytef)uVar14;
        BVar10 = *(Bytef *)((long)&strm->adler + 1);
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = BVar10;
        BVar10 = *(Bytef *)((long)&strm->adler + 2);
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = BVar10;
        BVar10 = *(Bytef *)((long)&strm->adler + 3);
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = BVar10;
        uVar14 = strm->total_in;
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = (Bytef)uVar14;
        BVar10 = *(Bytef *)((long)&strm->total_in + 1);
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = BVar10;
        BVar10 = *(Bytef *)((long)&strm->total_in + 2);
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = BVar10;
        uVar16 = strm->total_in >> 0x18;
      }
      else {
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = (Bytef)(uVar14 >> 0x18);
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = (Bytef)(uVar14 >> 0x10);
        uVar16 = strm->adler;
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = (Bytef)(uVar16 >> 8);
      }
      uVar15 = s->pending;
      s->pending = uVar15 + 1;
      s->pending_buf[uVar15] = (Bytef)uVar16;
      flush_pending(strm);
      if (0 < s->wrap) {
        s->wrap = -s->wrap;
      }
      return (uint)(s->pending == 0);
    }
  }
  else {
    flush_pending(strm);
    if (strm->avail_out != 0) goto LAB_00115cac;
LAB_00115c97:
    s->last_flush = -1;
  }
  return 0;
}

Assistant:

int ZEXPORT deflate (strm, flush)
    z_streamp strm;
    int flush;
{
    int old_flush; /* value of flush param for previous deflate call */
    deflate_state *s;

    if (deflateStateCheck(strm) || flush > Z_BLOCK || flush < 0) {
        return Z_STREAM_ERROR;
    }
    s = strm->state;

    if (strm->next_out == Z_NULL ||
        (strm->avail_in != 0 && strm->next_in == Z_NULL) ||
        (s->status == FINISH_STATE && flush != Z_FINISH)) {
        ERR_RETURN(strm, Z_STREAM_ERROR);
    }
    if (strm->avail_out == 0) ERR_RETURN(strm, Z_BUF_ERROR);

    old_flush = s->last_flush;
    s->last_flush = flush;

    /* Flush as much pending output as possible */
    if (s->pending != 0) {
        flush_pending(strm);
        if (strm->avail_out == 0) {
            /* Since avail_out is 0, deflate will be called again with
             * more output space, but possibly with both pending and
             * avail_in equal to zero. There won't be anything to do,
             * but this is not an error situation so make sure we
             * return OK instead of BUF_ERROR at next call of deflate:
             */
            s->last_flush = -1;
            return Z_OK;
        }

    /* Make sure there is something to do and avoid duplicate consecutive
     * flushes. For repeated and useless calls with Z_FINISH, we keep
     * returning Z_STREAM_END instead of Z_BUF_ERROR.
     */
    } else if (strm->avail_in == 0 && RANK(flush) <= RANK(old_flush) &&
               flush != Z_FINISH) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* User must not provide more input after the first FINISH: */
    if (s->status == FINISH_STATE && strm->avail_in != 0) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* Write the header */
    if (s->status == INIT_STATE) {
        /* zlib header */
        uInt header = (Z_DEFLATED + ((s->w_bits-8)<<4)) << 8;
        uInt level_flags;

        if (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2)
            level_flags = 0;
        else if (s->level < 6)
            level_flags = 1;
        else if (s->level == 6)
            level_flags = 2;
        else
            level_flags = 3;
        header |= (level_flags << 6);
        if (s->strstart != 0) header |= PRESET_DICT;
        header += 31 - (header % 31);

        putShortMSB(s, header);

        /* Save the adler32 of the preset dictionary: */
        if (s->strstart != 0) {
            putShortMSB(s, (uInt)(strm->adler >> 16));
            putShortMSB(s, (uInt)(strm->adler & 0xffff));
        }
        strm->adler = adler32(0L, Z_NULL, 0);
        s->status = BUSY_STATE;

        /* Compression must start with an empty pending buffer */
        flush_pending(strm);
        if (s->pending != 0) {
            s->last_flush = -1;
            return Z_OK;
        }
    }
#ifdef GZIP
    if (s->status == GZIP_STATE) {
        /* gzip header */
        strm->adler = crc32(0L, Z_NULL, 0);
        put_byte(s, 31);
        put_byte(s, 139);
        put_byte(s, 8);
        if (s->gzhead == Z_NULL) {
            put_byte(s, 0);
            put_byte(s, 0);
            put_byte(s, 0);
            put_byte(s, 0);
            put_byte(s, 0);
            put_byte(s, s->level == 9 ? 2 :
                     (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                      4 : 0));
            put_byte(s, OS_CODE);
            s->status = BUSY_STATE;

            /* Compression must start with an empty pending buffer */
            flush_pending(strm);
            if (s->pending != 0) {
                s->last_flush = -1;
                return Z_OK;
            }
        }
        else {
            put_byte(s, (s->gzhead->text ? 1 : 0) +
                     (s->gzhead->hcrc ? 2 : 0) +
                     (s->gzhead->extra == Z_NULL ? 0 : 4) +
                     (s->gzhead->name == Z_NULL ? 0 : 8) +
                     (s->gzhead->comment == Z_NULL ? 0 : 16)
                     );
            put_byte(s, (Byte)(s->gzhead->time & 0xff));
            put_byte(s, (Byte)((s->gzhead->time >> 8) & 0xff));
            put_byte(s, (Byte)((s->gzhead->time >> 16) & 0xff));
            put_byte(s, (Byte)((s->gzhead->time >> 24) & 0xff));
            put_byte(s, s->level == 9 ? 2 :
                     (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                      4 : 0));
            put_byte(s, s->gzhead->os & 0xff);
            if (s->gzhead->extra != Z_NULL) {
                put_byte(s, s->gzhead->extra_len & 0xff);
                put_byte(s, (s->gzhead->extra_len >> 8) & 0xff);
            }
            if (s->gzhead->hcrc)
                strm->adler = crc32(strm->adler, s->pending_buf,
                                    s->pending);
            s->gzindex = 0;
            s->status = EXTRA_STATE;
        }
    }
    if (s->status == EXTRA_STATE) {
        if (s->gzhead->extra != Z_NULL) {
            ulg beg = s->pending;   /* start of bytes to update crc */
            uInt left = (s->gzhead->extra_len & 0xffff) - s->gzindex;
            while (s->pending + left > s->pending_buf_size) {
                uInt copy = s->pending_buf_size - s->pending;
                zmemcpy(s->pending_buf + s->pending,
                        s->gzhead->extra + s->gzindex, copy);
                s->pending = s->pending_buf_size;
                HCRC_UPDATE(beg);
                s->gzindex += copy;
                flush_pending(strm);
                if (s->pending != 0) {
                    s->last_flush = -1;
                    return Z_OK;
                }
                beg = 0;
                left -= copy;
            }
            zmemcpy(s->pending_buf + s->pending,
                    s->gzhead->extra + s->gzindex, left);
            s->pending += left;
            HCRC_UPDATE(beg);
            s->gzindex = 0;
        }
        s->status = NAME_STATE;
    }
    if (s->status == NAME_STATE) {
        if (s->gzhead->name != Z_NULL) {
            ulg beg = s->pending;   /* start of bytes to update crc */
            int val;
            do {
                if (s->pending == s->pending_buf_size) {
                    HCRC_UPDATE(beg);
                    flush_pending(strm);
                    if (s->pending != 0) {
                        s->last_flush = -1;
                        return Z_OK;
                    }
                    beg = 0;
                }
                val = s->gzhead->name[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            HCRC_UPDATE(beg);
            s->gzindex = 0;
        }
        s->status = COMMENT_STATE;
    }
    if (s->status == COMMENT_STATE) {
        if (s->gzhead->comment != Z_NULL) {
            ulg beg = s->pending;   /* start of bytes to update crc */
            int val;
            do {
                if (s->pending == s->pending_buf_size) {
                    HCRC_UPDATE(beg);
                    flush_pending(strm);
                    if (s->pending != 0) {
                        s->last_flush = -1;
                        return Z_OK;
                    }
                    beg = 0;
                }
                val = s->gzhead->comment[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            HCRC_UPDATE(beg);
        }
        s->status = HCRC_STATE;
    }
    if (s->status == HCRC_STATE) {
        if (s->gzhead->hcrc) {
            if (s->pending + 2 > s->pending_buf_size) {
                flush_pending(strm);
                if (s->pending != 0) {
                    s->last_flush = -1;
                    return Z_OK;
                }
            }
            put_byte(s, (Byte)(strm->adler & 0xff));
            put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
            strm->adler = crc32(0L, Z_NULL, 0);
        }
        s->status = BUSY_STATE;

        /* Compression must start with an empty pending buffer */
        flush_pending(strm);
        if (s->pending != 0) {
            s->last_flush = -1;
            return Z_OK;
        }
    }
#endif

    /* Start a new block or continue the current one.
     */
    if (strm->avail_in != 0 || s->lookahead != 0 ||
        (flush != Z_NO_FLUSH && s->status != FINISH_STATE)) {
        block_state bstate;

        bstate = s->level == 0 ? deflate_stored(s, flush) :
                 s->strategy == Z_HUFFMAN_ONLY ? deflate_huff(s, flush) :
                 s->strategy == Z_RLE ? deflate_rle(s, flush) :
                 (*(configuration_table[s->level].func))(s, flush);

        if (bstate == finish_started || bstate == finish_done) {
            s->status = FINISH_STATE;
        }
        if (bstate == need_more || bstate == finish_started) {
            if (strm->avail_out == 0) {
                s->last_flush = -1; /* avoid BUF_ERROR next call, see above */
            }
            return Z_OK;
            /* If flush != Z_NO_FLUSH && avail_out == 0, the next call
             * of deflate should use the same flush parameter to make sure
             * that the flush is complete. So we don't have to output an
             * empty block here, this will be done at next call. This also
             * ensures that for a very small output buffer, we emit at most
             * one empty block.
             */
        }
        if (bstate == block_done) {
            if (flush == Z_PARTIAL_FLUSH) {
                _tr_align(s);
            } else if (flush != Z_BLOCK) { /* FULL_FLUSH or SYNC_FLUSH */
                _tr_stored_block(s, (char*)0, 0L, 0);
                /* For a full flush, this empty block will be recognized
                 * as a special marker by inflate_sync().
                 */
                if (flush == Z_FULL_FLUSH) {
                    CLEAR_HASH(s);             /* forget history */
                    if (s->lookahead == 0) {
                        s->strstart = 0;
                        s->block_start = 0L;
                        s->insert = 0;
                    }
                }
            }
            flush_pending(strm);
            if (strm->avail_out == 0) {
              s->last_flush = -1; /* avoid BUF_ERROR at next call, see above */
              return Z_OK;
            }
        }
    }

    if (flush != Z_FINISH) return Z_OK;
    if (s->wrap <= 0) return Z_STREAM_END;

    /* Write the trailer */
#ifdef GZIP
    if (s->wrap == 2) {
        put_byte(s, (Byte)(strm->adler & 0xff));
        put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 16) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 24) & 0xff));
        put_byte(s, (Byte)(strm->total_in & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 8) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 16) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 24) & 0xff));
    }
    else
#endif
    {
        putShortMSB(s, (uInt)(strm->adler >> 16));
        putShortMSB(s, (uInt)(strm->adler & 0xffff));
    }
    flush_pending(strm);
    /* If avail_out is zero, the application will call deflate again
     * to flush the rest.
     */
    if (s->wrap > 0) s->wrap = -s->wrap; /* write the trailer only once! */
    return s->pending != 0 ? Z_OK : Z_STREAM_END;
}